

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickle_step.c
# Opt level: O0

void delete_pickle_step_content(PickleStep *pickle_step)

{
  PickleStep *pickle_step_local;
  
  if (pickle_step->ast_node_ids != (PickleAstNodeIds_conflict *)0x0) {
    PickleAstNodeIds_delete((PickleAstNodeIds *)pickle_step->ast_node_ids);
  }
  if (pickle_step->id != (wchar_t *)0x0) {
    free(pickle_step->id);
  }
  if (pickle_step->text != (wchar_t *)0x0) {
    free(pickle_step->text);
  }
  if (pickle_step->argument != (PickleArgument *)0x0) {
    if (pickle_step->argument->type == Argument_String) {
      PickleString_delete((PickleString *)pickle_step->argument);
    }
    else if (pickle_step->argument->type == Argument_Table) {
      PickleTable_delete((PickleTable *)pickle_step->argument);
    }
  }
  return;
}

Assistant:

static void delete_pickle_step_content(const PickleStep* pickle_step) {
    if (pickle_step->ast_node_ids) {
        PickleAstNodeIds_delete(pickle_step->ast_node_ids);
    }
    if (pickle_step->id) {
        free((void*)pickle_step->id);
    }
    if (pickle_step->text) {
        free((void*)pickle_step->text);
    }
    if (pickle_step->argument) {
        if (pickle_step->argument->type == Argument_String) {
            PickleString_delete((const PickleString*)pickle_step->argument);
        }
        else if (pickle_step->argument->type == Argument_Table) {
            PickleTable_delete((const PickleTable*)pickle_step->argument);
        }
    }
}